

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGeoCube.h
# Opt level: O3

void pzgeom::TPZGeoCube::X<double>(TPZFMatrix<double> *nodes,TPZVec<double> *loc,TPZVec<double> *x)

{
  double dVar1;
  uint uVar2;
  double *pdVar3;
  int j;
  long lVar4;
  ulong uVar5;
  double extraout_XMM0_Qa;
  TPZFNMatrix<8,_double> phi;
  TPZFNMatrix<24,_double> dphi;
  TPZFMatrix<double> local_260;
  double local_1d0 [9];
  TPZFMatrix<double> local_188;
  double adStack_f8 [25];
  
  local_260.fElem = local_1d0;
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 8;
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01879930;
  local_260.fSize = 8;
  local_260.fGiven = local_260.fElem;
  TPZVec<int>::TPZVec(&local_260.fPivot.super_TPZVec<int>,0);
  local_260.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_260.fPivot.super_TPZVec<int>.fStore = local_260.fPivot.fExtAlloc;
  local_260.fPivot.super_TPZVec<int>.fNElements = 0;
  local_260.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_260.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_260.fWork.fStore = (double *)0x0;
  local_260.fWork.fNElements = 0;
  local_260.fWork.fNAlloc = 0;
  local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01879640;
  local_188.fElem = adStack_f8;
  local_188.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
  local_188.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 8;
  local_188.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_188.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_188.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01885290;
  local_188.fSize = 0x18;
  local_188.fGiven = local_188.fElem;
  TPZVec<int>::TPZVec(&local_188.fPivot.super_TPZVec<int>,0);
  local_188.fPivot.super_TPZVec<int>.fStore = local_188.fPivot.fExtAlloc;
  local_188.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_188.fPivot.super_TPZVec<int>.fNElements = 0;
  local_188.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_188.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_188.fWork.fStore = (double *)0x0;
  local_188.fWork.fNElements = 0;
  local_188.fWork.fNAlloc = 0;
  local_188.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01884fa0;
  pztopology::TPZCube::TShape<double>(loc,&local_260,&local_188);
  uVar2 = (uint)(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  if (0 < (int)uVar2) {
    pdVar3 = x->fStore;
    uVar5 = 0;
    do {
      pdVar3[uVar5] = 0.0;
      lVar4 = 0;
      do {
        if ((local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar4) ||
           (local_260.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        dVar1 = local_260.fElem[lVar4];
        (*(nodes->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(nodes,uVar5,lVar4);
        pdVar3 = x->fStore;
        pdVar3[uVar5] = dVar1 * extraout_XMM0_Qa + pdVar3[uVar5];
        lVar4 = lVar4 + 1;
      } while (lVar4 != 8);
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uVar2 & 0x7fffffff));
  }
  TPZFMatrix<double>::~TPZFMatrix(&local_188,&PTR_PTR_01885258);
  TPZFMatrix<double>::~TPZFMatrix(&local_260,&PTR_PTR_018798f8);
  return;
}

Assistant:

inline void TPZGeoCube::X(const TPZFMatrix<REAL> &nodes,TPZVec<T> &loc,TPZVec<T> &x){
        
        TPZFNMatrix<8,T> phi(NNodes,1);
        TPZFNMatrix<24,T> dphi(3,NNodes);
        TShape(loc,phi,dphi);
        int space = nodes.Rows();
        
        for(int i = 0; i < space; i++) {
            x[i] = 0.0;
            for(int j = 0; j < NNodes; j++) {
                x[i] += phi(j,0)*nodes.GetVal(i,j);
            }
        }
    }